

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint ON_SubDEdgeChain::SortEdgesIntoEdgeChains
               (ON_SubD *subd,ON_SimpleArray<ON_COMPONENT_INDEX> *unsorted_edges,
               ON_SimpleArray<ON_SubDEdgePtr> *sorted_edges)

{
  TYPE TVar1;
  uint uVar2;
  ON_COMPONENT_INDEX *pOVar3;
  ON_SubDEdge **unsorted_edges_00;
  ON_SubDEdge *local_68;
  ON_SubDEdge *e;
  ON_COMPONENT_INDEX local_4c;
  ON_COMPONENT_INDEX ci;
  uint i;
  ON_SimpleArray<const_ON_SubDEdge_*> local_unsorted_edges;
  uint unsorted_count;
  ON_SimpleArray<ON_SubDEdgePtr> *sorted_edges_local;
  ON_SimpleArray<ON_COMPONENT_INDEX> *unsorted_edges_local;
  ON_SubD *subd_local;
  
  TVar1 = ON_SimpleArray<ON_COMPONENT_INDEX>::UnsignedCount(unsorted_edges);
  ON_SimpleArray<const_ON_SubDEdge_*>::ON_SimpleArray
            ((ON_SimpleArray<const_ON_SubDEdge_*> *)&ci.m_index,(ulong)TVar1);
  for (ci.m_type = invalid_type; ci.m_type < TVar1; ci.m_type = ci.m_type + brep_vertex) {
    pOVar3 = ON_SimpleArray<ON_COMPONENT_INDEX>::operator[](unsorted_edges,ci.m_type);
    local_4c = *pOVar3;
    if ((((local_4c.m_type == subd_edge) && (local_4c.m_index != 0)) &&
        (local_4c.m_index != 0xffffffff)) &&
       (local_68 = ON_SubD::EdgeFromId(subd,local_4c.m_index), local_68 != (ON_SubDEdge *)0x0)) {
      ON_SimpleArray<const_ON_SubDEdge_*>::Append
                ((ON_SimpleArray<const_ON_SubDEdge_*> *)&ci.m_index,&local_68);
    }
  }
  unsorted_edges_00 =
       ON_SimpleArray<const_ON_SubDEdge_*>::Array
                 ((ON_SimpleArray<const_ON_SubDEdge_*> *)&ci.m_index);
  uVar2 = ON_SimpleArray<ON_COMPONENT_INDEX>::UnsignedCount(unsorted_edges);
  uVar2 = Internal_MuchImprovedSortEdgesIntoChains
                    ((ON__UINT_PTR *)unsorted_edges_00,(ulong)uVar2,sorted_edges);
  ON_SimpleArray<const_ON_SubDEdge_*>::~ON_SimpleArray
            ((ON_SimpleArray<const_ON_SubDEdge_*> *)&ci.m_index);
  return uVar2;
}

Assistant:

unsigned int ON_SubDEdgeChain::SortEdgesIntoEdgeChains(
  const ON_SubD& subd,
  const ON_SimpleArray< ON_COMPONENT_INDEX >& unsorted_edges,
  ON_SimpleArray< ON_SubDEdgePtr >& sorted_edges
)
{
  const unsigned unsorted_count = unsorted_edges.UnsignedCount();
  ON_SimpleArray< const ON_SubDEdge* > local_unsorted_edges(unsorted_count);
  for (unsigned i = 0; i < unsorted_count; ++i)
  {
    const ON_COMPONENT_INDEX ci = unsorted_edges[i];
    if (ON_COMPONENT_INDEX::TYPE::subd_edge != ci.m_type)
      continue;
    if (0 == ci.m_index || -1 == ci.m_index)
      continue;
    const ON_SubDEdge* e = subd.EdgeFromId((unsigned)ci.m_index);
    if (nullptr == e)
      continue;
    local_unsorted_edges.Append(e);
  }

  return Internal_MuchImprovedSortEdgesIntoChains(
    (const ON__UINT_PTR*)local_unsorted_edges.Array(),
    unsorted_edges.UnsignedCount(),
    sorted_edges
  );
}